

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# document.cpp
# Opt level: O2

tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
__thiscall sai::Document::GetThumbnail(Document *this)

{
  uint32_t uVar1;
  tuple<std::byte_*,_std::default_delete<std::byte[]>_> __s;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> extraout_RDX;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> extraout_RDX_00;
  _Head_base<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_false> _Var2;
  VirtualFileSystem *in_RSI;
  __extent_storage<18446744073709551615UL> __n;
  tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  tVar3;
  span<std::byte,_18446744073709551615UL> Destination;
  ThumbnailHeader Header;
  unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> Pixels;
  optional<sai::VirtualFileEntry> Thumbnail;
  uint local_a8;
  uint uStack_a4;
  uint32_t local_a0 [2];
  __uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_> local_98;
  _Optional_payload_base<sai::VirtualFileEntry> local_90;
  
  VirtualFileSystem::GetEntry((optional<sai::VirtualFileEntry> *)&local_90,in_RSI,"thumbnail");
  if (local_90._M_engaged == true) {
    VirtualFileEntry::Read<unsigned_int>((VirtualFileEntry *)&local_90,&local_a8);
    VirtualFileEntry::Read<unsigned_int>((VirtualFileEntry *)&local_90,&uStack_a4);
    VirtualFileEntry::Read<unsigned_int>((VirtualFileEntry *)&local_90,local_a0);
    uVar1 = Tag<(std::endian)1234,5ul>((char (*) [5])"BM32");
    if (local_a0[0] == uVar1) {
      __n._M_extent_value = (ulong)(local_a8 * uStack_a4) << 2;
      __s.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
      super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>)
           operator_new__(__n._M_extent_value);
      memset((void *)__s.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
                     super__Head_base<0UL,_std::byte_*,_false>._M_head_impl,0,__n._M_extent_value);
      Destination._M_extent._M_extent_value = __n._M_extent_value;
      Destination._M_ptr =
           (pointer)__s.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
                    super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
      local_98._M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
      super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
           (tuple<std::byte_*,_std::default_delete<std::byte[]>_>)
           (tuple<std::byte_*,_std::default_delete<std::byte[]>_>)
           __s.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
           super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
      VirtualFileEntry::Read((VirtualFileEntry *)&local_90,Destination);
      (this->super_VirtualFileSystem).FileStream.
      super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)CONCAT44(local_a8,uStack_a4);
      (this->super_VirtualFileSystem).FileStream.
      super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           __s.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
           super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
      local_98._M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
      super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
           (tuple<std::byte_*,_std::default_delete<std::byte[]>_>)
           (_Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>)0x0;
      std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>::~unique_ptr
                ((unique_ptr<std::byte[],_std::default_delete<std::byte[]>_> *)&local_98);
    }
    else {
      (this->super_VirtualFileSystem).FileStream.
      super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2> =
           (__shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>)0x0;
    }
    std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset(&local_90);
    _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t
    .super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
    super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         extraout_RDX_00._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
         _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
         super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  }
  else {
    std::_Optional_payload_base<sai::VirtualFileEntry>::_M_reset(&local_90);
    (this->super_VirtualFileSystem).FileStream.
    super___shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2> =
         (__shared_ptr<sai::ifstream,_(__gnu_cxx::_Lock_policy)2>)0x0;
    _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t
    .super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
    super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         (unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>)
         extraout_RDX._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
         super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
         super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  }
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  .super__Head_base<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>._M_t.
  super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
  super__Head_base<0UL,_std::byte_*,_false>._M_head_impl =
       _Var2._M_head_impl._M_t.super___uniq_ptr_impl<std::byte,_std::default_delete<std::byte[]>_>.
       _M_t.super__Tuple_impl<0UL,_std::byte_*,_std::default_delete<std::byte[]>_>.
       super__Head_base<0UL,_std::byte_*,_false>._M_head_impl;
  tVar3.
  super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  .super__Tuple_impl<1UL,_unsigned_int,_unsigned_int> =
       (_Tuple_impl<1UL,_unsigned_int,_unsigned_int>)this;
  return (tuple<std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
          )tVar3.
           super__Tuple_impl<0UL,_std::unique_ptr<std::byte[],_std::default_delete<std::byte[]>_>,_unsigned_int,_unsigned_int>
  ;
}

Assistant:

std::tuple<std::unique_ptr<std::byte[]>, std::uint32_t, std::uint32_t> Document::GetThumbnail()
{
	if( std::optional<VirtualFileEntry> Thumbnail = GetEntry("thumbnail"); Thumbnail )
	{
		ThumbnailHeader Header;
		Thumbnail->Read(Header.Width);
		Thumbnail->Read(Header.Height);
		Thumbnail->Read(Header.Magic);

		if( Header.Magic != sai::Tag<std::endian::little>("BM32") )
		{
			return std::make_tuple(nullptr, 0, 0);
		}

		const std::size_t            PixelCount = Header.Height * Header.Width;
		std::unique_ptr<std::byte[]> Pixels
			= std::make_unique<std::byte[]>(PixelCount * sizeof(std::uint32_t));

		Thumbnail->Read({Pixels.get(), PixelCount * sizeof(std::uint32_t)});

#if 0
		//// BGRA to RGBA
		std::size_t i = 0;

		//// Simd speedup, four pixels at a time
		while( i < ((PixelCount * sizeof(std::uint32_t)) & ~0xF) )
		{
			const __m128i Swizzle
				= _mm_set_epi8(15, 12, 13, 14, 11, 8, 9, 10, 7, 4, 5, 6, 3, 0, 1, 2);

			__m128i QuadPixel = _mm_loadu_si128(reinterpret_cast<__m128i*>(&Pixels[i]));

			QuadPixel = _mm_shuffle_epi8(QuadPixel, Swizzle);

			_mm_store_si128(reinterpret_cast<__m128i*>(&Pixels[i]), QuadPixel);

			i += (sizeof(std::uint32_t) * 4);
		}

		for( ; i < PixelCount * sizeof(std::uint32_t); i += sizeof(std::uint32_t) )
		{
			std::swap<std::byte>(Pixels[i], Pixels[i + 2]);
		}
#endif

		return std::make_tuple(std::move(Pixels), Header.Width, Header.Height);
	}
	return std::make_tuple(nullptr, 0, 0);
}